

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcWin.c
# Opt level: O1

void Wlc_WinCleanMark_rec(Wlc_Ntk_t *p,Wlc_Obj_t *pObj)

{
  int iVar1;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar2;
  ulong uVar3;
  long lVar4;
  
  if ((char)*(ushort *)pObj < '\0') {
    *(ushort *)pObj = *(ushort *)pObj & 0xff7f;
    uVar3 = (ulong)pObj->nFanins;
    if (0 < (int)pObj->nFanins) {
      lVar4 = 0;
      do {
        if ((2 < (uint)uVar3) ||
           (paVar2 = &pObj->field_10,
           (undefined1  [24])((undefined1  [24])*pObj & (undefined1  [24])0x2f) ==
           (undefined1  [24])0x6)) {
          paVar2 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pObj->field_10).pFanins[0];
        }
        iVar1 = paVar2->Fanins[lVar4];
        if (((long)iVar1 < 1) || (p->nObjsAlloc <= iVar1)) {
          __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                        ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
        }
        Wlc_WinCleanMark_rec(p,p->pObjs + iVar1);
        lVar4 = lVar4 + 1;
        uVar3 = (ulong)(int)pObj->nFanins;
      } while (lVar4 < (long)uVar3);
    }
  }
  return;
}

Assistant:

void Wlc_WinCleanMark_rec( Wlc_Ntk_t * p, Wlc_Obj_t * pObj )
{
    Wlc_Obj_t * pFanin;  int i;
    if ( !pObj->Mark )
        return;
    pObj->Mark = 0;
    Wlc_ObjForEachFaninObj( p, pObj, pFanin, i )
        Wlc_WinCleanMark_rec( p, pFanin );
}